

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall
google::LogMessage::LogMessage(LogMessage *this,char *file,int line,CheckOpString *result)

{
  ostream *poVar1;
  undefined8 *in_RCX;
  LogMessage *in_RDI;
  SendMethod in_stack_00000150;
  LogSeverity in_stack_00000160;
  int in_stack_00000164;
  char *in_stack_00000168;
  LogMessage *in_stack_00000170;
  
  in_RDI->allocated_ = (LogMessageData *)0x0;
  Init(in_stack_00000170,in_stack_00000168,in_stack_00000164,in_stack_00000160,in_stack_00000150);
  poVar1 = stream(in_RDI);
  poVar1 = std::operator<<(poVar1,"Check failed: ");
  poVar1 = std::operator<<(poVar1,(string *)*in_RCX);
  std::operator<<(poVar1," ");
  return;
}

Assistant:

LogMessage::LogMessage(const char* file, int line,
                       const CheckOpString& result)
    : allocated_(NULL) {
  Init(file, line, GLOG_FATAL, &LogMessage::SendToLog);
  stream() << "Check failed: " << (*result.str_) << " ";
}